

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

Emitter * __thiscall YAML::Emitter::Write(Emitter *this,_Null *param_2)

{
  bool bVar1;
  char *pcVar2;
  Emitter *in_RDI;
  Emitter *in_stack_ffffffffffffff88;
  ostream_wrapper *stream;
  undefined8 in_stack_ffffffffffffff98;
  value child;
  Emitter *in_stack_ffffffffffffffa0;
  allocator *paVar3;
  allocator local_39;
  string local_38 [56];
  
  child = (value)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  bVar1 = good((Emitter *)0xef9f7d);
  if (bVar1) {
    PrepareNode(in_stack_ffffffffffffffa0,child);
    stream = &in_RDI->m_stream;
    pcVar2 = ComputeNullName(in_stack_ffffffffffffff88);
    paVar3 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar2,paVar3);
    YAML::operator<<(stream,(string *)in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    StartedScalar((Emitter *)0xefa00e);
  }
  return in_RDI;
}

Assistant:

Emitter& Emitter::Write(const _Null& /*null*/) {
  if (!good())
    return *this;

  PrepareNode(EmitterNodeType::Scalar);

  m_stream << ComputeNullName();

  StartedScalar();

  return *this;
}